

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

bool __thiscall argo::json::operator<(json *this,char *s)

{
  pointer pcVar1;
  char *pcVar2;
  int iVar3;
  string *psVar4;
  char *local_38 [2];
  char local_28 [16];
  
  psVar4 = operator_cast_to_string_(this);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + psVar4->_M_string_length);
  pcVar2 = local_38[0];
  iVar3 = strcmp(local_38[0],s);
  if (pcVar2 != local_28) {
    operator_delete(pcVar2);
  }
  return SUB41((uint)iVar3 >> 0x1f,0);
}

Assistant:

bool json::operator<(const char *s) const
{
    return strcmp(static_cast<string>(*this).c_str(), s) < 0;
}